

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

string * __thiscall
BlurayHelper::ssifFileName_abi_cxx11_(string *__return_storage_ptr__,BlurayHelper *this,int num)

{
  char __rhs;
  allocator<char> local_1e0;
  allocator<char> local_1df;
  allocator<char> local_1de;
  allocator<char> local_1dd;
  int num_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  num_local = num;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    std::__cxx11::string::string((string *)&prefix,(string *)&this->m_dstPath);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"",(allocator<char> *)&local_1d8);
  }
  __rhs = '/';
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    __rhs = getDirSeparator();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"BDMV",&local_1dd);
  std::operator+(&local_d8,&prefix,&local_f8);
  std::operator+(&local_b8,&local_d8,__rhs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"STREAM",&local_1de);
  std::operator+(&local_98,&local_b8,&local_118);
  std::operator+(&local_78,&local_98,__rhs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"SSIF",&local_1df);
  std::operator+(&local_58,&local_78,&local_138);
  std::operator+(&local_38,&local_58,__rhs);
  int32ToStr_abi_cxx11_(&local_178,&num_local);
  strPadLeft(&local_158,&local_178,5,'0');
  std::operator+(&local_1d8,&local_38,&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,".ssif",&local_1e0);
  std::operator+(__return_storage_ptr__,&local_1d8,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

string BlurayHelper::ssifFileName(const int num) const
{
    const string prefix = m_isoWriter ? "" : m_dstPath;
    const char separator = m_isoWriter ? '/' : getDirSeparator();
    return prefix + string("BDMV") + separator + string("STREAM") + separator + string("SSIF") + separator +
           strPadLeft(int32ToStr(num), 5, '0') + string(".ssif");
}